

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rewind-window.cc
# Opt level: O3

void __thiscall Debugger::RewindWindow::Tick(RewindWindow *this)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  undefined8 uVar2;
  _Alloc_hider _Var3;
  Debugger *pDVar4;
  bool bVar5;
  bool bVar6;
  Bool BVar7;
  Ticks TVar8;
  ImVec2 IVar9;
  long lVar10;
  Ticks TVar11;
  ImDrawList *this_00;
  size_t size;
  size_t size_00;
  size_t extraout_RDX;
  size_t extraout_RDX_00;
  size_t extraout_RDX_01;
  size_t size_01;
  size_t size_02;
  size_t size_03;
  size_t extraout_RDX_02;
  size_t extraout_RDX_03;
  size_t extraout_RDX_04;
  size_t extraout_RDX_05;
  size_t extraout_RDX_06;
  size_t extraout_RDX_07;
  size_t size_04;
  size_t extraout_RDX_08;
  size_t extraout_RDX_09;
  size_t extraout_RDX_10;
  size_t sVar12;
  size_t size_05;
  size_t size_06;
  int iVar13;
  ulong uVar14;
  Debugger *pDVar15;
  float v_max;
  ulong uVar16;
  float fVar17;
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  double dVar20;
  undefined8 extraout_XMM0_Qb;
  undefined1 auVar21 [8];
  undefined1 auVar22 [8];
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  undefined1 auVar25 [16];
  undefined1 auVar26 [16];
  float fVar27;
  JoypadStats JVar28;
  bool rewinding;
  int frame;
  int offset_cy;
  ImVec2 ul_pos;
  ImVec2 br_pos;
  RewindStats rw_stats;
  bool local_149;
  undefined1 local_148 [8];
  double dStack_140;
  undefined1 local_138 [16];
  undefined1 local_128 [16];
  string local_118;
  ImVec2 local_f8;
  double dStack_f0;
  Debugger *local_e0;
  undefined1 local_d8 [16];
  undefined1 local_c8 [16];
  Ticks local_b8;
  Ticks local_b0;
  Debugger *local_a8;
  ImVec2 local_a0;
  RewindStats local_98;
  
  if ((this->super_Window).is_open == true) {
    bVar5 = ImGui::Begin("Rewind",&(this->super_Window).is_open,0);
    if (bVar5) {
      BVar7 = host_is_rewinding(((this->super_Window).d)->host);
      local_149 = BVar7 != FALSE;
      bVar5 = ImGui::Checkbox("Rewind",&local_149);
      if (bVar5) {
        pDVar15 = (this->super_Window).d;
        if (local_149 == true) {
          BeginRewind(pDVar15);
        }
        else {
          EndRewind(pDVar15);
        }
      }
      if (local_149 == true) {
        TVar8 = emulator_get_ticks(((this->super_Window).d)->e);
        IVar9 = (ImVec2)host_get_rewind_oldest_ticks(((this->super_Window).d)->host);
        local_148 = (undefined1  [8])TVar8;
        uVar16 = TVar8 - (long)IVar9;
        TVar8 = host_newest_ticks(((this->super_Window).d)->host);
        fVar27 = (float)(uVar16 / 0x11250);
        local_f8 = IVar9;
        local_138._0_4_ = fVar27;
        ImGui::PushButtonRepeat(true);
        local_98.base_bytes = 0;
        bVar5 = ImGui::Button("-1",(ImVec2 *)&local_98);
        if (bVar5) {
          local_138._0_4_ = local_138._0_4_ + -1;
        }
        ImGui::SameLine(0.0,-1.0);
        local_98.base_bytes = 0;
        bVar5 = ImGui::Button("+1",(ImVec2 *)&local_98);
        if (bVar5) {
          local_138._0_4_ = local_138._0_4_ + 1;
        }
        ImGui::PopButtonRepeat();
        ImGui::SameLine(0.0,-1.0);
        v_max = (float)((TVar8 - (long)IVar9) / 0x11250);
        ImGui::SliderInt("Frames",(int *)local_138,0,(int)v_max,"%d",0);
        fVar17 = 0.0;
        if (0 < (int)local_138._0_4_) {
          fVar17 = (float)local_138._0_4_;
        }
        if ((int)v_max <= (int)fVar17) {
          fVar17 = v_max;
        }
        local_138._0_4_ = fVar17;
        local_118._M_dataplus._M_p._0_4_ = (int)uVar16 + (int)fVar27 * -0x11250;
        ImGui::PushButtonRepeat(true);
        local_98.base_bytes = 0;
        bVar5 = ImGui::Button("-I",(ImVec2 *)&local_98);
        if (bVar5) {
          local_118._M_dataplus._M_p._0_4_ = (int)local_118._M_dataplus._M_p + -0x1c;
        }
        ImGui::SameLine(0.0,-1.0);
        local_98.base_bytes = 0;
        bVar6 = ImGui::Button("+I",(ImVec2 *)&local_98);
        if (bVar6) {
          local_118._M_dataplus._M_p._0_4_ = (int)local_118._M_dataplus._M_p + 1;
        }
        ImGui::PopButtonRepeat();
        ImGui::SameLine(0.0,-1.0);
        ImGui::SliderInt("Tick Offset",(int *)&local_118,0,0x1124f,"%d",0);
        uVar14 = (long)(int)local_118._M_dataplus._M_p + (long)(int)local_138._0_4_ * 0x11250;
        if ((uVar16 != uVar14) && (RewindTo((this->super_Window).d,uVar14 + (long)local_f8), bVar5))
        {
          emulator_write_state(((this->super_Window).d)->e,&this->reverse_step_save_state);
          uVar16 = emulator_get_ticks(((this->super_Window).d)->e);
          iVar13 = -1;
          auVar21 = local_148;
          while (uVar16 < (ulong)auVar21) {
            emulator_step(((this->super_Window).d)->e);
            uVar16 = emulator_get_ticks(((this->super_Window).d)->e);
            iVar13 = iVar13 + 1;
          }
          emulator_read_state(((this->super_Window).d)->e,&this->reverse_step_save_state);
          if (0 < iVar13) {
            do {
              emulator_step(((this->super_Window).d)->e);
              iVar13 = iVar13 + -1;
            } while (iVar13 != 0);
          }
        }
      }
      ImGui::Separator();
      JVar28 = host_get_joypad_stats(((this->super_Window).d)->host);
      host_get_rewind_stats(&local_98,((this->super_Window).d)->host);
      sVar12 = local_98.base_bytes;
      local_148 = (undefined1  [8])local_98.uncompressed_bytes;
      local_a8 = (Debugger *)local_98.used_bytes;
      local_e0 = (Debugger *)local_98.capacity_bytes;
      local_b0 = host_newest_ticks(((this->super_Window).d)->host);
      local_b8 = host_oldest_ticks(((this->super_Window).d)->host);
      PrettySize_abi_cxx11_((string *)local_138,(Debugger *)JVar28.used_bytes,size);
      uVar2 = local_138._0_8_;
      PrettySize_abi_cxx11_(&local_118,(Debugger *)JVar28.capacity_bytes,size_00);
      ImGui::Text("joypad used/capacity: %s/%s",uVar2,local_118._M_dataplus._M_p);
      paVar1 = &local_118.field_2;
      size_01 = extraout_RDX;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_118._M_dataplus._M_p != paVar1) {
        operator_delete(local_118._M_dataplus._M_p);
        size_01 = extraout_RDX_00;
      }
      if ((undefined1 *)local_138._0_8_ != local_128) {
        operator_delete((void *)local_138._0_8_);
        size_01 = extraout_RDX_01;
      }
      PrettySize_abi_cxx11_((string *)local_138,(Debugger *)sVar12,size_01);
      uVar2 = local_138._0_8_;
      PrettySize_abi_cxx11_(&local_118,(Debugger *)local_98.diff_bytes,size_02);
      _Var3._M_p = local_118._M_dataplus._M_p;
      pDVar15 = (Debugger *)
                ((long)&(((EmulatorInit *)local_98.diff_bytes)->rom).data +
                (long)&((EmulatorInit *)sVar12)->rom);
      PrettySize_abi_cxx11_((string *)local_d8,pDVar15,size_03);
      auVar21 = local_148;
      auVar18._8_4_ = (int)((ulong)pDVar15 >> 0x20);
      auVar18._0_8_ = pDVar15;
      auVar18._12_4_ = 0x45300000;
      dStack_f0 = auVar18._8_8_ - 1.9342813113834067e+25;
      local_f8 = (ImVec2)(dStack_f0 +
                         ((double)CONCAT44(0x43300000,(int)pDVar15) - 4503599627370496.0));
      auVar23._8_4_ = local_148._4_4_;
      auVar23._0_8_ = local_148;
      auVar23._12_4_ = 0x45300000;
      ImGui::Text("rewind base/diff/total: %s/%s/%s (%.0f%%)",
                  ((double)local_f8 * 100.0) /
                  ((auVar23._8_8_ - 1.9342813113834067e+25) +
                  ((double)CONCAT44(0x43300000,local_148._0_4_) - 4503599627370496.0)),uVar2,
                  _Var3._M_p,CONCAT44(local_d8._4_4_,local_d8._0_4_));
      pDVar15 = local_e0;
      sVar12 = extraout_RDX_02;
      if ((undefined1 *)CONCAT44(local_d8._4_4_,local_d8._0_4_) != local_c8) {
        operator_delete((undefined1 *)CONCAT44(local_d8._4_4_,local_d8._0_4_));
        sVar12 = extraout_RDX_03;
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_118._M_dataplus._M_p != paVar1) {
        operator_delete(local_118._M_dataplus._M_p);
        sVar12 = extraout_RDX_04;
      }
      if ((undefined1 *)local_138._0_8_ != local_128) {
        operator_delete((void *)local_138._0_8_);
        sVar12 = extraout_RDX_05;
      }
      PrettySize_abi_cxx11_((string *)local_138,(Debugger *)auVar21,sVar12);
      ImGui::Text("rewind uncomp: %s",local_138._0_8_);
      sVar12 = extraout_RDX_06;
      if ((undefined1 *)local_138._0_8_ != local_128) {
        operator_delete((void *)local_138._0_8_);
        sVar12 = extraout_RDX_07;
      }
      pDVar4 = local_a8;
      PrettySize_abi_cxx11_((string *)local_138,local_a8,sVar12);
      uVar2 = local_138._0_8_;
      PrettySize_abi_cxx11_(&local_118,pDVar15,size_04);
      auVar24._8_4_ = (int)((ulong)pDVar4 >> 0x20);
      auVar24._0_8_ = pDVar4;
      auVar24._12_4_ = 0x45300000;
      auVar25._8_4_ = (int)((ulong)pDVar15 >> 0x20);
      auVar25._0_8_ = pDVar15;
      auVar25._12_4_ = 0x45300000;
      ImGui::Text("rewind used: %s/%s (%.0f%%)",
                  (((auVar24._8_8_ - 1.9342813113834067e+25) +
                   ((double)CONCAT44(0x43300000,(int)pDVar4) - 4503599627370496.0)) * 100.0) /
                  ((auVar25._8_8_ - 1.9342813113834067e+25) +
                  ((double)CONCAT44(0x43300000,(int)pDVar15) - 4503599627370496.0)),uVar2,
                  local_118._M_dataplus._M_p);
      lVar10 = local_b0 - local_b8;
      auVar19._8_4_ = (int)((ulong)lVar10 >> 0x20);
      auVar19._0_8_ = lVar10;
      auVar19._12_4_ = 0x45300000;
      dVar20 = auVar19._8_8_ - 1.9342813113834067e+25;
      auVar21 = (undefined1  [8])
                (dVar20 + ((double)CONCAT44(0x43300000,(int)lVar10) - 4503599627370496.0));
      sVar12 = extraout_RDX_08;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_118._M_dataplus._M_p != paVar1) {
        local_148 = auVar21;
        dStack_140 = dVar20;
        operator_delete(local_118._M_dataplus._M_p);
        sVar12 = extraout_RDX_09;
        auVar21 = local_148;
        dVar20 = dStack_140;
      }
      auVar22 = (undefined1  [8])((double)auVar21 * 2.384185791015625e-07);
      if ((undefined1 *)local_138._0_8_ != local_128) {
        local_148 = (undefined1  [8])((double)auVar21 * 2.384185791015625e-07);
        dStack_140 = dVar20;
        operator_delete((void *)local_138._0_8_);
        sVar12 = extraout_RDX_10;
        auVar22 = local_148;
      }
      local_f8 = (ImVec2)((double)local_f8 / (double)auVar22);
      PrettySize_abi_cxx11_
                ((string *)local_138,
                 (Debugger *)
                 ((long)((double)local_f8 - 9.223372036854776e+18) & (long)(double)local_f8 >> 0x3f
                 | (long)(double)local_f8),sVar12);
      uVar2 = local_138._0_8_;
      local_f8 = (ImVec2)((double)local_f8 * 60.0);
      PrettySize_abi_cxx11_
                (&local_118,
                 (Debugger *)
                 ((long)((double)local_f8 - 9.223372036854776e+18) & (long)(double)local_f8 >> 0x3f
                 | (long)(double)local_f8),size_05);
      _Var3._M_p = local_118._M_dataplus._M_p;
      uVar16 = (ulong)((double)local_f8 * 60.0);
      PrettySize_abi_cxx11_
                ((string *)local_d8,
                 (Debugger *)
                 ((long)((double)local_f8 * 60.0 - 9.223372036854776e+18) & (long)uVar16 >> 0x3f |
                 uVar16),size_06);
      ImGui::Text("rate: %s/sec %s/min %s/hr",uVar2,_Var3._M_p,
                  CONCAT44(local_d8._4_4_,local_d8._0_4_));
      if ((undefined1 *)CONCAT44(local_d8._4_4_,local_d8._0_4_) != local_c8) {
        operator_delete((undefined1 *)CONCAT44(local_d8._4_4_,local_d8._0_4_));
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_118._M_dataplus._M_p != paVar1) {
        operator_delete(local_118._M_dataplus._M_p);
      }
      if ((undefined1 *)local_138._0_8_ != local_128) {
        operator_delete((void *)local_138._0_8_);
      }
      TVar8 = host_get_rewind_oldest_ticks(((this->super_Window).d)->host);
      TVar11 = host_get_rewind_newest_ticks(((this->super_Window).d)->host);
      lVar10 = TVar11 - TVar8;
      auVar26._8_4_ = (int)((ulong)lVar10 >> 0x20);
      auVar26._0_8_ = lVar10;
      auVar26._12_4_ = 0x45300000;
      ImGui::Text("range: [%lu..%lu] (%.0f sec)",
                  ((auVar26._8_8_ - 1.9342813113834067e+25) +
                  ((double)CONCAT44(0x43300000,(int)lVar10) - 4503599627370496.0)) *
                  2.384185791015625e-07,TVar8,TVar11);
      IVar9 = ImGui::GetCursorScreenPos();
      dStack_140 = (double)extraout_XMM0_Qb;
      local_148._0_4_ = IVar9.x;
      local_148._4_4_ = IVar9.y;
      local_f8 = ImGui::GetContentRegionAvail();
      this_00 = ImGui::GetWindowDrawList();
      local_d8._0_4_ = local_148._0_4_;
      local_d8._4_4_ = local_148._4_4_;
      local_a0.x = local_f8.x + (float)local_148._0_4_;
      local_a0.y = (float)local_148._4_4_ + 64.0;
      ImDrawList::AddRectFilled(this_00,(ImVec2 *)local_d8,&local_a0,0xff000000,0.0,0);
      local_138._0_4_ = (float)local_d8._0_4_ + 4.0;
      local_138._4_4_ = (float)local_d8._4_4_ + 4.0;
      local_118._M_dataplus._M_p = (pointer)CONCAT44(local_a0.y + -4.0,local_a0.x + -4.0);
      ImDrawList::AddRectFilled(this_00,(ImVec2 *)local_138,(ImVec2 *)&local_118,0xffffffff,0.0,0);
      fVar27 = local_f8.x + -8.0;
      _local_148 = ZEXT416((uint)fVar27);
      fVar17 = (float)pDVar15;
      local_e0 = (Debugger *)CONCAT44(local_e0._4_4_,fVar17);
      local_118._M_dataplus._M_p =
           (pointer)CONCAT44((float)local_d8._4_4_ + 4.0 + 56.0,
                             ((float)local_98.data_ranges[1] * fVar27) / fVar17 +
                             (float)local_d8._0_4_ + 4.0);
      local_138._4_4_ = (float)local_d8._4_4_ + 4.0;
      local_138._0_4_ =
           (float)local_d8._0_4_ + 4.0 + ((float)local_98.data_ranges[0] * fVar27) / fVar17;
      ImDrawList::AddRectFilled(this_00,(ImVec2 *)local_138,(ImVec2 *)&local_118,0xfff38bff,0.0,0);
      local_118._M_dataplus._M_p =
           (pointer)CONCAT44((float)local_d8._4_4_ + 4.0 + 56.0,
                             ((float)local_98.data_ranges[3] * (float)local_148._0_4_) /
                             local_e0._0_4_ + (float)local_d8._0_4_ + 4.0);
      local_138._4_4_ = (float)local_d8._4_4_ + 4.0;
      local_138._0_4_ =
           (float)local_d8._0_4_ + 4.0 +
           ((float)local_98.data_ranges[2] * (float)local_148._0_4_) / local_e0._0_4_;
      ImDrawList::AddRectFilled(this_00,(ImVec2 *)local_138,(ImVec2 *)&local_118,0xffac5eb5,0.0,0);
      local_118._M_dataplus._M_p =
           (pointer)CONCAT44((float)local_d8._4_4_ + 4.0 + 56.0,
                             ((float)local_98.info_ranges[1] * (float)local_148._0_4_) /
                             local_e0._0_4_ + (float)local_d8._0_4_ + 4.0);
      local_138._4_4_ = (float)local_d8._4_4_ + 4.0;
      local_138._0_4_ =
           (float)local_d8._0_4_ + 4.0 +
           ((float)local_98.info_ranges[0] * (float)local_148._0_4_) / local_e0._0_4_;
      ImDrawList::AddRectFilled(this_00,(ImVec2 *)local_138,(ImVec2 *)&local_118,0xff64ea54,0.0,0);
      local_118._M_dataplus._M_p =
           (pointer)CONCAT44((float)local_d8._4_4_ + 4.0 + 56.0,
                             ((float)local_148._0_4_ * (float)local_98.info_ranges[3]) /
                             local_e0._0_4_ + (float)local_d8._0_4_ + 4.0);
      local_138._4_4_ = (float)local_d8._4_4_ + 4.0;
      local_138._0_4_ =
           (float)local_d8._0_4_ + 4.0 +
           ((float)local_98.info_ranges[2] * (float)local_148._0_4_) / local_e0._0_4_;
      ImDrawList::AddRectFilled(this_00,(ImVec2 *)local_138,(ImVec2 *)&local_118,0xff3eab32,0.0,0);
      local_138._4_4_ = 64.0;
      local_138._0_4_ = local_f8.x;
      ImGui::Dummy((ImVec2 *)local_138);
    }
    ImGui::End();
  }
  return;
}

Assistant:

void Debugger::RewindWindow::Tick() {
  if (!is_open) return;

  if (ImGui::Begin(Debugger::s_rewind_window_name, &is_open)) {
    bool rewinding = host_is_rewinding(d->host);
    if (ImGui::Checkbox("Rewind", &rewinding)) {
      if (rewinding) {
        d->BeginRewind();
      } else {
        d->EndRewind();
      }
    }

    if (rewinding) {
      Ticks cur_cy = emulator_get_ticks(d->e);
      Ticks oldest_cy = host_get_rewind_oldest_ticks(d->host);
      Ticks rel_cur_cy = cur_cy - oldest_cy;
      u32 range_fr = (host_newest_ticks(d->host) - oldest_cy) / PPU_FRAME_TICKS;

      // Frames.
      int frame = rel_cur_cy / PPU_FRAME_TICKS;

      ImGui::PushButtonRepeat(true);
      if (ImGui::Button("-1")) {
        --frame;
      }
      ImGui::SameLine();
      if (ImGui::Button("+1")) {
        ++frame;
      }
      ImGui::PopButtonRepeat();
      ImGui::SameLine();
      ImGui::SliderInt("Frames", &frame, 0, range_fr);

      frame = CLAMP(frame, 0, static_cast<int>(range_fr));

      // Ticks.
      int offset_cy = rel_cur_cy % PPU_FRAME_TICKS;
      bool reverse_step = false;

      ImGui::PushButtonRepeat(true);
      if (ImGui::Button("-I")) {
        offset_cy -= 28;
        reverse_step = true;
      }
      ImGui::SameLine();
      if (ImGui::Button("+I")) {
        offset_cy += 1;
      }
      ImGui::PopButtonRepeat();
      ImGui::SameLine();
      ImGui::SliderInt("Tick Offset", &offset_cy, 0, PPU_FRAME_TICKS - 1);

      Ticks rel_seek_cy = (Ticks)frame * PPU_FRAME_TICKS + offset_cy;

      if (rel_cur_cy != rel_seek_cy) {
        d->RewindTo(oldest_cy + rel_seek_cy);

        // Reverse stepping is tricky because we don't know how long the
        // previous instruction took. We can rewind by 28 ticks (longer than
        // any instruction or interrupt dispatch) and step forward until just
        // before the current tick. But since we don't know how long a step
        // will take, it's easier to just save state, step forward one
        // instruction too far, then load state and step just before it.
        if (reverse_step) {
          emulator_write_state(d->e, &reverse_step_save_state);
          int count = 0;
          for (; emulator_get_ticks(d->e) < cur_cy; ++count) {
            emulator_step(d->e);
          }

          emulator_read_state(d->e, &reverse_step_save_state);
          for (int i = 0; i < count - 1; ++i) {
            emulator_step(d->e);
          }
        }
      }
    }

    ImGui::Separator();
    JoypadStats joyp_stats = host_get_joypad_stats(d->host);
    RewindStats rw_stats = host_get_rewind_stats(d->host);
    size_t base = rw_stats.base_bytes;
    size_t diff = rw_stats.diff_bytes;
    size_t total = base + diff;
    size_t uncompressed = rw_stats.uncompressed_bytes;
    size_t used = rw_stats.used_bytes;
    size_t capacity = rw_stats.capacity_bytes;
    Ticks total_ticks = host_newest_ticks(d->host) - host_oldest_ticks(d->host);
    f64 sec = (f64)total_ticks / CPU_TICKS_PER_SECOND;

    ImGui::Text("joypad used/capacity: %s/%s",
                d->PrettySize(joyp_stats.used_bytes).c_str(),
                d->PrettySize(joyp_stats.capacity_bytes).c_str());

    ImGui::Text("rewind base/diff/total: %s/%s/%s (%.0f%%)",
                d->PrettySize(base).c_str(), d->PrettySize(diff).c_str(),
                d->PrettySize(total).c_str(), (f64)(total)*100 / uncompressed);
    ImGui::Text("rewind uncomp: %s", d->PrettySize(uncompressed).c_str());
    ImGui::Text("rewind used: %s/%s (%.0f%%)", d->PrettySize(used).c_str(),
                d->PrettySize(capacity).c_str(), (f64)used * 100 / capacity);
    ImGui::Text("rate: %s/sec %s/min %s/hr", d->PrettySize(total / sec).c_str(),
                d->PrettySize(total / sec * 60).c_str(),
                d->PrettySize(total / sec * 60 * 60).c_str());

    Ticks oldest = host_get_rewind_oldest_ticks(d->host);
    Ticks newest = host_get_rewind_newest_ticks(d->host);
    f64 range = (f64)(newest - oldest) / CPU_TICKS_PER_SECOND;
    ImGui::Text("range: [%" PRIu64 "..%" PRIu64 "] (%.0f sec)", oldest, newest,
                range);

    ImVec2 cursor = ImGui::GetCursorScreenPos();
    ImVec2 avail_size = ImGui::GetContentRegionAvail();
    ImDrawList* draw_list = ImGui::GetWindowDrawList();

    f32 w = avail_size.x, h = 64;
    ImVec2 ul_pos = cursor;
    ImVec2 br_pos = ul_pos + ImVec2(w, h);
    ImVec2 margin(4, 4);
    draw_list->AddRectFilled(ul_pos, br_pos, IM_COL32_BLACK);
    draw_list->AddRectFilled(ul_pos + margin, br_pos - margin, IM_COL32_WHITE);

    auto xoffset = [&](size_t x) -> f32 {
      return (f32)x * (w - margin.x * 2) / (f32)capacity;
    };

    auto draw_bar = [&](size_t l, size_t r, ImU32 col) {
      ImVec2 ul = ul_pos + margin + ImVec2(xoffset(l), 0);
      ImVec2 br = ul_pos + margin + ImVec2(xoffset(r), h - margin.y * 2);
      draw_list->AddRectFilled(ul, br, col);
    };

    draw_bar(rw_stats.data_ranges[0], rw_stats.data_ranges[1], 0xfff38bff);
    draw_bar(rw_stats.data_ranges[2], rw_stats.data_ranges[3], 0xffac5eb5);
    draw_bar(rw_stats.info_ranges[0], rw_stats.info_ranges[1], 0xff64ea54);
    draw_bar(rw_stats.info_ranges[2], rw_stats.info_ranges[3], 0xff3eab32);
    ImGui::Dummy(ImVec2(w, h));
  }
  ImGui::End();
}